

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgQuaternion.cpp
# Opt level: O3

void __thiscall dgQuaternion::dgQuaternion(dgQuaternion *this,dgVector *unitAxis,HaF32 Angle)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  float fVar4;
  undefined1 auVar5 [16];
  
  fVar4 = cosf((float)Angle * 0.5);
  this->m_q0 = (HaF32)fVar4;
  fVar4 = sinf((float)Angle * 0.5);
  uVar1 = (unitAxis->super_dgTemplateVector<float>).m_x;
  uVar3 = (unitAxis->super_dgTemplateVector<float>).m_y;
  auVar5._0_4_ = fVar4 * (float)uVar1;
  auVar5._4_4_ = fVar4 * (float)uVar3;
  auVar5._8_4_ = fVar4 * 0.0;
  auVar5._12_4_ = fVar4 * 0.0;
  uVar2 = vmovlps_avx(auVar5);
  this->m_q1 = (HaF32)(int)uVar2;
  this->m_q2 = (HaF32)(int)((ulong)uVar2 >> 0x20);
  this->m_q3 = (HaF32)(fVar4 * (unitAxis->super_dgTemplateVector<float>).m_z);
  return;
}

Assistant:

dgQuaternion::dgQuaternion (const dgVector &unitAxis, hacd::HaF32 Angle)
{
	hacd::HaF32 sinAng;

	Angle *= hacd::HaF32 (0.5f);
	m_q0 = dgCos (Angle);
	sinAng = dgSin (Angle);

#ifdef _DEBUG
	if (dgAbsf (Angle) > hacd::HaF32(dgEPSILON / 10.0f)) {
		HACD_ASSERT (dgAbsf (hacd::HaF32(1.0f) - unitAxis % unitAxis) < hacd::HaF32(dgEPSILON * 10.0f));
	} 
#endif
	m_q1 = unitAxis.m_x * sinAng;
	m_q2 = unitAxis.m_y * sinAng;
	m_q3 = unitAxis.m_z * sinAng;

}